

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::IsImplicitWeakField
               (FieldDescriptor *field,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  MessageSCCAnalyzer *pMVar1;
  bool bVar2;
  Type TVar3;
  FileDescriptor *pFVar4;
  Descriptor *pDVar5;
  SCC *pSVar6;
  SCC *pSVar7;
  bool local_41;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  MessageSCCAnalyzer *local_20;
  MessageSCCAnalyzer *scc_analyzer_local;
  Options *options_local;
  FieldDescriptor *field_local;
  
  local_20 = scc_analyzer;
  scc_analyzer_local = (MessageSCCAnalyzer *)options;
  options_local = (Options *)field;
  pFVar4 = FieldDescriptor::file(field);
  bVar2 = UsingImplicitWeakFields(pFVar4,(Options *)scc_analyzer_local);
  local_41 = false;
  if (bVar2) {
    TVar3 = FieldDescriptor::type((FieldDescriptor *)options_local);
    local_41 = false;
    if (TVar3 == TYPE_MESSAGE) {
      bVar2 = FieldDescriptor::is_required((FieldDescriptor *)options_local);
      local_41 = false;
      if (!bVar2) {
        bVar2 = FieldDescriptor::is_map((FieldDescriptor *)options_local);
        local_41 = false;
        if (!bVar2) {
          bVar2 = FieldDescriptor::is_extension((FieldDescriptor *)options_local);
          local_41 = false;
          if (!bVar2) {
            pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)options_local);
            pFVar4 = Descriptor::file(pDVar5);
            bVar2 = IsWellKnownMessage(pFVar4);
            local_41 = false;
            if (!bVar2) {
              pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)options_local);
              pFVar4 = Descriptor::file(pDVar5);
              local_30 = FileDescriptor::name(pFVar4);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_40,"net/proto2/proto/descriptor.proto");
              bVar2 = std::operator!=(local_30,local_40);
              pMVar1 = local_20;
              local_41 = false;
              if (bVar2) {
                pDVar5 = FieldDescriptor::containing_type((FieldDescriptor *)options_local);
                pSVar6 = MessageSCCAnalyzer::GetSCC(pMVar1,pDVar5);
                pMVar1 = local_20;
                pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)options_local);
                pSVar7 = MessageSCCAnalyzer::GetSCC(pMVar1,pDVar5);
                local_41 = pSVar6 != pSVar7;
              }
            }
          }
        }
      }
    }
  }
  return local_41;
}

Assistant:

bool IsImplicitWeakField(const FieldDescriptor* field, const Options& options,
                         MessageSCCAnalyzer* scc_analyzer) {
  return UsingImplicitWeakFields(field->file(), options) &&
         field->type() == FieldDescriptor::TYPE_MESSAGE &&
         !field->is_required() && !field->is_map() && !field->is_extension() &&
         !IsWellKnownMessage(field->message_type()->file()) &&
         field->message_type()->file()->name() !=
             "net/proto2/proto/descriptor.proto" &&
         // We do not support implicit weak fields between messages in the same
         // strongly-connected component.
         scc_analyzer->GetSCC(field->containing_type()) !=
             scc_analyzer->GetSCC(field->message_type());
}